

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestStart
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  char *test_case;
  char *test;
  TestInfo *test_info_local;
  PrettyUnitTestResultPrinter *this_local;
  
  ColoredPrintf(COLOR_GREEN,"[ RUN      ] ");
  test_case = String::c_str(&this->test_case_name_);
  test = TestInfo::name(test_info);
  PrintTestName(test_case,test);
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestStart(const TestInfo& test_info) {
  ColoredPrintf(COLOR_GREEN,  "[ RUN      ] ");
  PrintTestName(test_case_name_.c_str(), test_info.name());
  printf("\n");
  fflush(stdout);
}